

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder *origSegment;
  CapTableBuilder *capTable;
  ElementSize elementSize_00;
  bool bVar1;
  WirePointer *pWVar2;
  BuilderArena *orphanArena;
  word *pwVar3;
  Fault local_20;
  Fault f;
  ElementSize elementSize_local;
  OrphanBuilder *this_local;
  
  f.exception._7_1_ = elementSize;
  pWVar2 = tagAsPtr(this);
  bVar1 = WirePointer::isNull(pWVar2);
  if (bVar1 == (this->location == (word *)0x0)) {
    pWVar2 = tagAsPtr(this);
    elementSize_00 = f.exception._7_1_;
    pwVar3 = this->location;
    origSegment = this->segment;
    capTable = this->capTable;
    orphanArena = SegmentBuilder::getArena(this->segment);
    WireHelpers::getWritableListPointer
              (__return_storage_ptr__,pWVar2,pwVar3,origSegment,capTable,elementSize_00,(word *)0x0,
               orphanArena);
    pwVar3 = ListBuilder::getLocation(__return_storage_ptr__);
    this->location = pwVar3;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xdd6,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

ListBuilder OrphanBuilder::asList(ElementSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  // (Actually, currently this is not true for primitive lists, but let's not turn into a bug if
  // it changes!)
  location = result.getLocation();

  return result;
}